

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

string * Catch::trim(string *str)

{
  long lVar1;
  char *in_RSI;
  string *in_RDI;
  size_type end;
  size_type start;
  
  lVar1 = std::__cxx11::string::find_first_not_of(in_RSI,(ulong)trim::whitespaceChars);
  std::__cxx11::string::find_last_not_of(in_RSI,(ulong)trim::whitespaceChars);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)in_RSI);
  }
  return in_RDI;
}

Assistant:

std::string trim( std::string const& str ) {
        static char const* whitespaceChars = "\n\r\t ";
        std::string::size_type start = str.find_first_not_of( whitespaceChars );
        std::string::size_type end = str.find_last_not_of( whitespaceChars );

        return start != std::string::npos ? str.substr( start, 1+end-start ) : std::string();
    }